

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void exprListDeleteNN(sqlite3 *db,ExprList *pList)

{
  int iVar1;
  sqlite3 *in_RSI;
  ExprList_item *pItem;
  int i;
  Expr *in_stack_ffffffffffffffd8;
  sqlite3 *db_00;
  undefined4 in_stack_ffffffffffffffe8;
  
  iVar1 = *(int *)&in_RSI->pVfs;
  db_00 = (sqlite3 *)&in_RSI->pVdbe;
  do {
    sqlite3ExprDelete(db_00,in_stack_ffffffffffffffd8);
    if (db_00->pVdbe != (Vdbe *)0x0) {
      sqlite3DbNNFreeNN(in_RSI,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
    }
    db_00 = (sqlite3 *)&db_00->mutex;
    iVar1 = iVar1 + -1;
  } while (0 < iVar1);
  sqlite3DbNNFreeNN(in_RSI,(void *)CONCAT44(iVar1,in_stack_ffffffffffffffe8));
  return;
}

Assistant:

static SQLITE_NOINLINE void exprListDeleteNN(sqlite3 *db, ExprList *pList){
  int i = pList->nExpr;
  struct ExprList_item *pItem =  pList->a;
  assert( pList->nExpr>0 );
  assert( db!=0 );
  do{
    sqlite3ExprDelete(db, pItem->pExpr);
    if( pItem->zEName ) sqlite3DbNNFreeNN(db, pItem->zEName);
    pItem++;
  }while( --i>0 );
  sqlite3DbNNFreeNN(db, pList);
}